

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void test_arithmetic(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Calc *pCVar2;
  pointer *__ptr;
  double dVar3;
  unique_ptr<Calc,_std::default_delete<Calc>_> calc;
  Calc *local_38;
  string local_30;
  
  DefaultCalc();
  pCVar2 = local_38;
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"5 1 2 + 4 * + 3 -","");
  dVar3 = Calc::eval(pCVar2,&local_30);
  AssertEqD(dVar3,14.0,0x3a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  pCVar2 = local_38;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"15 7 1 1 + - / 3 * 2 1 1 + + -","");
  dVar3 = Calc::eval(pCVar2,&local_30);
  AssertEqD(dVar3,5.0,0x3c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_38 != (Calc *)0x0) {
    std::default_delete<Calc>::operator()((default_delete<Calc> *)&local_38,local_38);
  }
  return;
}

Assistant:

void test_arithmetic() {
  auto calc = DefaultCalc();
  AssertEqD(calc->eval("5 1 2 + 4 * + 3 -"), 14.0, __LINE__);
  // 15 7 1 1 + - / 3 * 2 1 1 + + 1
  AssertEqD(calc->eval("15 7 1 1 + - / 3 * 2 1 1 + + -"), 5.0, __LINE__);
}